

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ab_algorithm.c
# Opt level: O3

void aba_c(void)

{
  double dVar1;
  double dVar2;
  int iVar3;
  code *pcVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int *piVar15;
  double dVar16;
  solver_state_c s;
  long local_190;
  int local_170 [4];
  long local_160;
  long local_158;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  undefined8 *local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  code *local_38;
  
  setup_simple_state_c(&two_dof_robot_c,local_170);
  *local_100 = 0x3ff0000000000000;
  local_100[1] = 0x3ff0000000000000;
  *local_f8 = 0x3ff0000000000000;
  local_f8[1] = 0x3ff0000000000000;
  **(undefined8 **)(local_68 + -8 + (long)local_170[0] * 0x10) = 0x3ff0000000000000;
  lVar10 = (long)local_170[0] * 0x10;
  *(undefined8 *)(*(long *)(local_68 + -8 + lVar10) + 8) = 0x3ff0000000000000;
  *(undefined8 *)(*(long *)(local_68 + -8 + lVar10) + 0x10) = 0x3ff0000000000000;
  *local_90 = 0x3ff0000000000000;
  local_90[1] = 0x3ff0000000000000;
  *(undefined8 *)(*(long *)(local_108 + 8) + 0x10) = 0x40239eb851eb851f;
  if (0 < (long)local_170[0]) {
    lVar14 = 0xd8;
    lVar11 = 0;
    lVar13 = 0;
    lVar6 = 0;
    lVar10 = 0;
    do {
      piVar15 = (int *)(_kca_ifk + lVar11 + 0x10);
      lVar9 = (long)*piVar15 * 0x40;
      (**(code **)(&kcc_joint + lVar9))(piVar15,(long)local_100 + lVar13,local_160 + lVar10);
      gc_pose_compose(local_160 + lVar10,_kca_ifk + lVar11,local_158 + lVar10);
      (**(code **)(gc_acc_twist_tf_ref_to_tgt + lVar9))
                (piVar15,(long)local_f8 + lVar13,local_148 + lVar10);
      gc_twist_tf_ref_to_tgt(local_158 + lVar10,local_138 + lVar10,local_140 + lVar10);
      lVar8 = lVar10 + 0x10;
      gc_twist_accumulate(local_140 + lVar10,local_148 + lVar10,local_138 + lVar8);
      (**(code **)(&two_dof_robot_c + lVar9))
                (piVar15,local_138 + lVar8,(long)local_f8 + lVar13,local_128 + lVar10);
      mc_rbi_to_abi(_kca_ifk + lVar11 + 0x28,local_e8 + lVar14);
      mc_rbi_map_twist_to_momentum(_kca_ifk + lVar11 + 0x28,local_138 + lVar8,local_c8 + lVar10);
      mc_momentum_derive(local_138 + lVar8,local_c8 + lVar10,local_c0 + lVar8);
      mc_wrench_invert(lVar10 + local_68,local_60 + lVar8,1);
      lVar9 = (long)local_170[0];
      lVar6 = lVar6 + 1;
      lVar13 = lVar13 + 8;
      lVar11 = lVar11 + 0x90;
      lVar14 = lVar14 + 0xd8;
      lVar10 = lVar8;
    } while (lVar6 < lVar9);
    if (0 < local_170[0]) {
      uVar7 = lVar9 + 1;
      local_190 = lVar9 * 8;
      lVar11 = lVar9 * 0x90 + -0x80;
      lVar10 = lVar9 << 4;
      lVar6 = lVar9 * 0xd8;
      do {
        local_190 = local_190 + -8;
        lVar9 = _kca_ifk + lVar11;
        lVar8 = (long)*(int *)(_kca_ifk + lVar11) * 0x40;
        lVar14 = lVar6 + -0xd8;
        (**(code **)(ga_pose_compose + lVar8))(lVar9,local_e8 + lVar6,local_e0 + lVar14);
        lVar13 = lVar10 + -0x10;
        mc_abi_tf_tgt_to_ref(local_158 + lVar13,local_e0 + lVar14,local_d8 + lVar6);
        mc_abi_add(local_e8 + lVar14,local_d8 + lVar6,local_e8 + lVar14);
        mc_abi_map_acc_twist_to_wrench(local_e8 + lVar6,local_128 + lVar13,local_b8 + lVar13);
        mc_wrench_add(local_b8 + lVar13,local_c0 + lVar10,local_b8 + lVar13,1);
        local_38 = *(code **)(mc_abi_map_acc_twist_to_wrench + lVar8);
        (*local_38)(lVar9,local_e8 + lVar6,local_b8 + lVar13,local_b0 + lVar13,1);
        mc_wrench_tf_tgt_to_ref(local_158 + lVar13,local_b0 + lVar13,local_a8 + lVar13,1);
        mc_wrench_add(local_c0 + lVar13,local_a8 + lVar13,local_c0 + lVar13,1);
        (**(code **)(gc_acc_twist_accumulate + lVar8))
                  (lVar9,local_e8 + lVar6,(long)local_90 + local_190,local_78 + lVar13,1);
        pcVar4 = local_38;
        (*local_38)(lVar9,local_e8 + lVar6,local_88 + lVar10,local_80 + lVar13,1);
        mc_wrench_add(local_80 + lVar13,local_78 + lVar13,local_80 + lVar13,1);
        mc_wrench_tf_tgt_to_ref(local_158 + lVar13,local_80 + lVar13,local_88 + lVar13,1);
        (*pcVar4)(lVar9,lVar6 + local_e8,lVar10 + local_60,local_58 + lVar13,1);
        mc_wrench_tf_tgt_to_ref(local_158 + lVar13,local_58 + lVar13,local_50 + lVar13,1);
        mc_wrench_add(local_60 + lVar13,local_50 + lVar13,local_60 + lVar13,1);
        uVar7 = uVar7 - 1;
        lVar11 = lVar11 + -0x90;
        lVar10 = lVar13;
        lVar6 = lVar14;
      } while (1 < uVar7);
    }
  }
  mc_abi_log(local_e8);
  mc_wrench_log(local_c0,1);
  mc_wrench_log(local_88,1);
  mc_wrench_log(local_60,1);
  lVar10 = (long)local_170[0];
  if (0 < lVar10) {
    lVar13 = 0x10;
    lVar14 = 0xd8;
    lVar8 = 0;
    lVar11 = 0;
    lVar6 = 0;
    do {
      lVar5 = _kca_ifk;
      lVar10 = _kca_ifk + lVar13;
      iVar3 = *(int *)(_kca_ifk + lVar13);
      gc_acc_twist_tf_ref_to_tgt(local_158 + lVar6,local_108 + lVar6,local_118 + lVar6);
      gc_acc_twist_accumulate(local_118 + lVar6,local_128 + lVar6,local_110 + lVar6);
      mc_abi_map_acc_twist_to_wrench(local_e8 + lVar14,local_110 + lVar6,local_a0 + lVar6);
      lVar12 = (long)iVar3 * 0x40;
      pcVar4 = *(code **)(kca_ifk + lVar12);
      (*pcVar4)(lVar10,local_a0 + lVar6,local_98 + lVar8,1);
      lVar9 = lVar6 + 0x10;
      (*pcVar4)(lVar10,local_88 + lVar9,local_70 + lVar8,1);
      (*pcVar4)(lVar10,local_60 + lVar9,local_48 + lVar8,1);
      dVar1 = *(double *)(lVar14 + 0x90 + (long)*(int *)(lVar5 + 8 + lVar13) * 0x20 + local_e8);
      dVar2 = **(double **)(lVar5 + 0x10 + lVar13);
      dVar16 = ((*(double *)((long)local_90 + lVar8) - *(double *)(local_70 + lVar8)) -
               *(double *)(local_98 + lVar8)) - *(double *)(local_48 + lVar8);
      *(double *)(local_40 + lVar8) = dVar16;
      *(double *)(local_f0 + lVar8) = dVar16 / (dVar1 + dVar2);
      (**(code **)(&two_dof_robot_a + lVar12))(lVar10,local_f0 + lVar8,local_130 + lVar6);
      gc_acc_twist_add(local_130 + lVar6,local_128 + lVar6,local_120 + lVar6);
      gc_acc_twist_accumulate(local_118 + lVar6,lVar6 + local_120,local_108 + lVar9);
      lVar10 = (long)local_170[0];
      lVar11 = lVar11 + 1;
      lVar8 = lVar8 + 8;
      lVar13 = lVar13 + 0x90;
      lVar14 = lVar14 + 0xd8;
      lVar6 = lVar9;
    } while (lVar11 < lVar10);
  }
  gc_acc_twist_log(lVar10 * 0x10 + local_108);
  return;
}

Assistant:

void aba_c()
{
    struct kcc_kinematic_chain *kc = &two_dof_robot_c;
    struct solver_state_c s;

    setup_simple_state_c(kc, &s);

    s.q[0] = 1.0;
    s.q[1] = 1.0;
    s.qd[0] = 1.0;
    s.qd[1] = 1.0;
    s.f_ext[s.nbody - 1].force[0].x = 1.0;
    s.f_ext[s.nbody - 1].force[0].y = 1.0;
    s.f_ext[s.nbody - 1].force[0].z = 1.0;
    s.tau_ff[0] = 1.0;
    s.tau_ff[1] = 1.0;
    s.xdd->linear_acceleration[0].z = 9.81;


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kcc_joint *joint = &kc->segment[i - 1].joint;
        int joint_type = joint->type;

        // Position
        //

        // X_{J,i}
        kcc_joint[joint_type].fpk(joint, &s.q[i - 1], &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        gc_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kcc_joint[joint_type].fvk(joint, &s.qd[i - 1], &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        gc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        gc_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);


        // Acceleration
        //

        // Xdd_{bias,i} = S_i qdd_i + Sd_i qd_i + Xd_i x S_i qd_i
        kcc_joint[joint_type].inertial_acceleration(joint, &s.xd[i], &s.qd[i - 1], &s.xdd_bias[i - 1]);


        // Inertia
        //

        // M_i^A = M_i
        mc_rbi_to_abi(&kc->segment[i - 1].link.inertia, &s.m_art[i]);


        // Force
        //

        // P_i = M_i Xd_i
        mc_rbi_map_twist_to_momentum(&kc->segment[i - 1].link.inertia, &s.xd[i], &s.p[i - 1]);

        // F_{bias,i}^A = Xd_i x* P_i
        mc_momentum_derive(&s.xd[i], &s.p[i - 1], &s.f_bias_art[i]);


        // F_{ext,i}^A = -F_{ext,i}
        mc_wrench_invert(&s.f_ext[i - 1], &s.f_ext_art[i], 1);
    }


    for (int i = s.nbody; i > 0; i--) {
        struct kcc_joint *joint = &kc->segment[i - 1].joint;
        int joint_type = joint->type;

        // Inertia
        //

        // M_i^a = P_i^T M_i^A
        kcc_joint[joint_type].project_inertia(joint, &s.m_art[i], &s.m_app[i - 1]);

        // M_{i-1}^a' = {i-1}^X_i* M_i^a i^X_{i-1}
        mc_abi_tf_tgt_to_ref(&s.x_rel[i - 1], &s.m_app[i - 1], &s.m_tf[i]);

        // M_{i-1}^A += M_{i-1}^a'
        mc_abi_add(&s.m_art[i - 1], &s.m_tf[i], &s.m_art[i - 1]);


        // Force
        //

        // F_{bias,i}^A' = M_i^A Xdd_{bias,i}
        mc_abi_map_acc_twist_to_wrench(&s.m_art[i], &s.xdd_bias[i - 1], &s.f_bias_eom[i - 1]);

        // F_{bias,i}^A' += F_{bias,i}^A
        mc_wrench_add(&s.f_bias_eom[i - 1], &s.f_bias_art[i], &s.f_bias_eom[i - 1], 1);

        // F_{bias,i}^a = P_i^T F_{bias,i}^A'
        kcc_joint[joint_type].project_wrench(joint, &s.m_art[i], &s.f_bias_eom[i - 1], &s.f_bias_app[i - 1], 1);

        // F_{bias,i}^a' = {i-1}^X_i* F_{bias,i}^a
        mc_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_bias_app[i - 1], &s.f_bias_tf[i - 1], 1);

        // F_{bias,i-1}^A += F_{bias,i}^a'
        mc_wrench_add(&s.f_bias_art[i - 1], &s.f_bias_tf[i - 1], &s.f_bias_art[i - 1], 1);


        // F_{tau,i} = M_i^A S_i D^{-1} tau_{ff,i}
        kcc_joint[joint_type].ffd(joint, &s.m_art[i], &s.tau_ff[i - 1], &s.f_ff_jnt[i - 1], 1);

        // F_{tau,i}^a = P_i^T F_{tau,i}^A
        kcc_joint[joint_type].project_wrench(joint, &s.m_art[i], &s.f_ff_art[i], &s.f_ff_app[i - 1], 1);

        // F_{tau,i}^a += F_{tau,i}'
        mc_wrench_add(&s.f_ff_app[i - 1], &s.f_ff_jnt[i - 1], &s.f_ff_app[i - 1], 1);

        // F_{tau,i-1}^A = {i-1}^X_i* F_{tau,i}^a
        mc_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_ff_app[i - 1], &s.f_ff_art[i - 1], 1);


        // F_{ext,i}^a = P_i^T F_{ext,i}^A
        kcc_joint[joint_type].project_wrench(joint, &s.m_art[i], &s.f_ext_art[i], &s.f_ext_app[i - 1], 1);

        // F_{ext,i}^a' = {i-1}^X_i* F_{ext,i}^a
        mc_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_ext_app[i - 1], &s.f_ext_tf[i - 1], 1);

        // F_{ext,i-1}^A += F_{ext,i}^a'
        mc_wrench_add(&s.f_ext_art[i - 1], &s.f_ext_tf[i - 1], &s.f_ext_art[i - 1], 1);
    }

    mc_abi_log(&s.m_art[0]);
    mc_wrench_log(&s.f_bias_art[0], 1);
    mc_wrench_log(&s.f_ff_art[0], 1);
    mc_wrench_log(&s.f_ext_art[0], 1);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kcc_joint *joint = &kc->segment[i - 1].joint;
        int joint_type = joint->type;

        // Acceleration
        //

        // Xdd_{i-1}' = i^X_{i-1} Xdd_{i-1}
        gc_acc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xdd[i - 1], &s.xdd_tf[i - 1]);

        // Xdd_{nact,i-1} = Xdd_{i-1}' + Xdd_{bias,i-1}
        gc_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_bias[i - 1], &s.xdd_nact[i - 1]);


        // Force
        //

        // F_{nact,i} = M_i^A Xdd_{nact,i-1}'
        mc_abi_map_acc_twist_to_wrench(&s.m_art[i], &s.xdd_nact[i - 1], &s.f_bias_nact[i - 1]);

        // tau_{bias,i}^A = S^T F_{bias,i}
        kcc_joint[joint_type].ifk(joint, &s.f_bias_nact[i - 1], &s.tau_bias_art[i - 1], 1);


        // tau_{ff,i}^A = S^T F_{ff,i}
        kcc_joint[joint_type].ifk(joint, &s.f_ff_art[i], &s.tau_ff_art[i - 1], 1);


        // tau_{ext,i}^A = S^T F_{ext,i}
        kcc_joint[joint_type].ifk(joint, &s.f_ext_art[i], &s.tau_ext_art[i - 1], 1);


        // Solve
        //
        int k = joint->revolute_joint.axis;
        double d = s.m_art[i].second_moment_of_mass.row[k].data[k] + joint->revolute_joint.inertia[0];
        s.tau_ctrl[i - 1] = s.tau_ff[i - 1] - s.tau_ff_art[i - 1] - s.tau_bias_art[i - 1] - s.tau_ext_art[i - 1];
        s.qdd[i - 1] = s.tau_ctrl[i - 1] / d;


        // Resultant acceleration
        //

        // Xdd_{J,i} = S_i qdd_i
        kcc_joint[joint_type].fak(joint, &s.qdd[i - 1], &s.xdd_jnt[i - 1]);

        // Xdd_{J,i}' = Xdd_{J,i} + Xdd_{bias,i}
        gc_acc_twist_add(&s.xdd_jnt[i - 1], &s.xdd_bias[i - 1], &s.xdd_net[i - 1]);

        // Xdd_i = Xdd_{i-1}' + Xdd_{J,i}'
        gc_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_net[i - 1], &s.xdd[i]);
    }

    gc_acc_twist_log(&s.xdd[s.nbody]);
}